

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O3

bool __thiscall
draco::KdTreeAttributesEncoder::EncodePortableAttributes
          (KdTreeAttributesEncoder *this,EncoderBuffer *out_buffer)

{
  byte bVar1;
  uint uVar2;
  uint32_t dimension;
  uint uVar3;
  PointDVectorIterator end;
  PointDVectorIterator end_00;
  PointDVectorIterator end_01;
  PointDVectorIterator end_02;
  PointDVectorIterator end_03;
  PointDVectorIterator end_04;
  PointDVectorIterator end_05;
  void *pvVar4;
  undefined1 auVar5 [24];
  undefined1 auVar6 [24];
  undefined1 auVar7 [24];
  undefined1 auVar8 [24];
  undefined1 auVar9 [24];
  undefined1 auVar10 [24];
  undefined1 auVar11 [24];
  char cVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  DataType DVar16;
  pointer piVar17;
  ulong uVar18;
  uint32_t uVar19;
  _Head_base<0UL,_draco::PointAttribute_*,_false> this_00;
  AttributeValueIndex AVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_point;
  PointDVector<unsigned_int> point_vector;
  vector<int,_std::allocator<int>_> signed_point;
  char local_a09;
  uint local_a08;
  allocator_type local_a01;
  int local_a00;
  int local_9fc;
  uint32_t local_9f8;
  undefined4 uStack_9f4;
  long local_9e8;
  uint local_9e0;
  int local_9dc;
  int local_9d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_9d0;
  pointer local_9b8;
  ulong local_9b0;
  EncoderBuffer *local_9a8;
  ulong local_9a0;
  uint *puStack_998;
  int local_990;
  undefined4 uStack_98c;
  undefined8 local_988;
  uint *puStack_980;
  int local_978;
  undefined4 uStack_974;
  ulong local_970;
  uint *puStack_968;
  int local_960;
  undefined4 uStack_95c;
  undefined8 local_958;
  uint *puStack_950;
  int local_948;
  undefined4 uStack_944;
  ulong local_940;
  uint *puStack_938;
  int local_930;
  undefined4 uStack_92c;
  undefined8 local_928;
  uint *puStack_920;
  int local_918;
  undefined4 uStack_914;
  ulong local_910;
  uint *puStack_908;
  int local_900;
  undefined4 uStack_8fc;
  undefined8 local_8f8;
  uint *puStack_8f0;
  int local_8e8;
  undefined4 uStack_8e4;
  ulong local_8e0;
  uint *puStack_8d8;
  int local_8d0;
  undefined4 uStack_8cc;
  undefined8 local_8c8;
  uint *puStack_8c0;
  int local_8b8;
  undefined4 uStack_8b4;
  ulong local_8b0;
  uint *puStack_8a8;
  int local_8a0;
  undefined4 uStack_89c;
  undefined8 local_898;
  uint *puStack_890;
  int local_888;
  undefined4 uStack_884;
  ulong local_880;
  uint *puStack_878;
  int local_870;
  undefined4 uStack_86c;
  undefined8 local_868;
  uint *puStack_860;
  int local_858;
  undefined4 uStack_854;
  undefined1 local_850 [2080];
  
  iVar14 = EncoderOptionsBase<int>::GetSpeed
                     (((this->super_AttributesEncoder).point_cloud_encoder_)->options_);
  iVar15 = 6;
  if (10 - iVar14 < 6) {
    iVar15 = 10 - iVar14;
  }
  local_9dc = this->num_components_;
  cVar12 = (char)iVar15;
  local_a09 = '\x05';
  if (local_9dc < 0x10) {
    local_a09 = cVar12;
  }
  if (cVar12 != '\x06') {
    local_a09 = cVar12;
  }
  if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)out_buffer,
               (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_a09,&local_a08);
    local_9dc = this->num_components_;
  }
  uVar2 = ((this->super_AttributesEncoder).point_cloud_encoder_)->point_cloud_->num_points_;
  uVar18 = (ulong)uVar2;
  local_9d8 = local_9dc * 4;
  local_9e0 = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_9d0,(ulong)(local_9dc * uVar2),(allocator_type *)local_850);
  local_9b8 = local_9d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  piVar17 = (this->super_AttributesEncoder).point_attribute_ids_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->super_AttributesEncoder).point_attribute_ids_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar17) >> 2) != 0) {
    uVar23 = 0;
    local_a00 = 0;
    local_9fc = 0;
    uVar22 = 0;
    local_9a8 = out_buffer;
    do {
      this_00._M_head_impl =
           *(PointAttribute **)
            &(((this->super_AttributesEncoder).point_cloud_encoder_)->point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[piVar17[(int)uVar22]]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
      DVar16 = *(DataType *)((long)this_00._M_head_impl + 0x1c);
      if (5 < DVar16 - DT_INT8) {
        if ((DVar16 != DT_FLOAT32) ||
           (this_00._M_head_impl =
                 *(PointAttribute **)
                  &(this->quantized_portable_attributes_).
                   super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_a00]._M_t.
                   super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                   ._M_t, this_00._M_head_impl == (PointAttribute *)0x0))
        goto switchD_0016800d_default;
        local_a00 = local_a00 + 1;
        DVar16 = *(DataType *)((long)this_00._M_head_impl + 0x1c);
      }
      local_a08 = uVar22;
      switch(DVar16) {
      case DT_INT8:
      case DT_INT16:
      case DT_INT32:
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_850,
                   (ulong)*(uint8_t *)
                           ((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18),
                   (allocator_type *)&local_9f8);
        local_9b0 = uVar23;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_9f8,
                   (ulong)*(uint8_t *)
                           ((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18),
                   &local_a01);
        if (uVar18 != 0) {
          uVar23 = local_9b0 & 0xffffffff;
          lVar25 = (long)local_9fc;
          uVar24 = 0;
          do {
            AVar20.value_ = (uint)uVar24;
            if (*(char *)&((GeometryAttribute *)&(this_00._M_head_impl)->identity_mapping_)->buffer_
                == '\0') {
              AVar20.value_ =
                   *(uint *)((long)((GeometryAttribute *)&(this_00._M_head_impl)->indices_map_)->
                                   buffer_ + uVar24 * 4);
            }
            GeometryAttribute::ConvertValue<int>
                      (&(this_00._M_head_impl)->super_GeometryAttribute,AVar20,
                       *(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18),
                       (int *)local_850._0_8_);
            bVar1 = *(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18);
            if ((ulong)bVar1 != 0) {
              piVar17 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              uVar21 = 0;
              do {
                *(uint *)((long)CONCAT44(uStack_9f4,local_9f8) + uVar21 * 4) =
                     *(uint *)(local_850._0_8_ + uVar21 * 4) - piVar17[lVar25 + uVar21];
                uVar21 = uVar21 + 1;
              } while (bVar1 != uVar21);
            }
            memcpy(local_9b8 + local_9dc * (uint)uVar24 + uVar23,
                   (void *)CONCAT44(uStack_9f4,local_9f8),(ulong)bVar1 << 2);
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar18);
        }
        bVar1 = *(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18);
        pvVar4 = (void *)CONCAT44(uStack_9f4,local_9f8);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,local_9e8 - (long)pvVar4);
        }
        uVar23 = local_9b0;
        uVar22 = local_a08;
        if ((uint *)local_850._0_8_ != (uint *)0x0) {
          operator_delete((void *)local_850._0_8_,local_850._16_8_ - local_850._0_8_);
        }
        local_9fc = local_9fc + (uint)bVar1;
        break;
      default:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_850,
                   (ulong)*(uint8_t *)
                           ((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18),
                   (allocator_type *)&local_9f8);
        if (uVar18 != 0) {
          uVar24 = 0;
          do {
            AVar20.value_ = (uint)uVar24;
            if (*(char *)&((GeometryAttribute *)&(this_00._M_head_impl)->identity_mapping_)->buffer_
                != '\x01') {
              AVar20.value_ =
                   *(uint *)((long)((GeometryAttribute *)&(this_00._M_head_impl)->indices_map_)->
                                   buffer_ + uVar24 * 4);
            }
            GeometryAttribute::ConvertValue<unsigned_int>
                      (&(this_00._M_head_impl)->super_GeometryAttribute,AVar20,
                       *(uint8_t *)((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18),
                       (uint *)local_850._0_8_);
            memcpy(local_9b8 + local_9dc * (uint)uVar24 + uVar23,(void *)local_850._0_8_,
                   (ulong)*(uint8_t *)
                           ((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18) << 2);
            uVar24 = uVar24 + 1;
          } while (uVar18 != uVar24);
        }
        uVar22 = local_a08;
        if ((uint *)local_850._0_8_ != (uint *)0x0) {
          operator_delete((void *)local_850._0_8_,local_850._16_8_ - local_850._0_8_);
          uVar22 = local_a08;
        }
        break;
      case DT_UINT32:
        if (uVar18 != 0) {
          uVar24 = 0;
          do {
            uVar22 = (uint)uVar24;
            if (*(char *)&((GeometryAttribute *)&(this_00._M_head_impl)->identity_mapping_)->buffer_
                != '\x01') {
              uVar22 = *(uint *)((long)((GeometryAttribute *)&(this_00._M_head_impl)->indices_map_)
                                       ->buffer_ + uVar24 * 4);
            }
            memcpy(local_9b8 + local_9dc * (uint)uVar24 + uVar23,
                   (void *)((ulong)uVar22 *
                            *(int64_t *)
                             ((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x28) +
                            **(long **)&(this_00._M_head_impl)->super_GeometryAttribute +
                           *(int64_t *)
                            ((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x30)),
                   (ulong)*(uint8_t *)
                           ((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18) << 2);
            uVar24 = uVar24 + 1;
            uVar22 = local_a08;
          } while (uVar18 != uVar24);
        }
      }
      uVar23 = (ulong)((int)uVar23 +
                      (uint)*(uint8_t *)
                             ((long)&(this_00._M_head_impl)->super_GeometryAttribute + 0x18));
      uVar22 = uVar22 + 1;
      piVar17 = (this->super_AttributesEncoder).point_attribute_ids_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      out_buffer = local_9a8;
    } while (uVar22 < (uint)((ulong)((long)(this->super_AttributesEncoder).point_attribute_ids_.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish - (long)piVar17) >> 2))
    ;
  }
  dimension = this->num_components_;
  if ((int)(uVar2 * dimension) < 1) {
    uVar19 = 0;
  }
  else {
    uVar18 = 0;
    uVar19 = 0;
    do {
      uVar22 = local_9b8[uVar18];
      if (uVar22 != 0) {
        uVar3 = 0x1f;
        if (uVar22 != 0) {
          for (; uVar22 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        if ((int)uVar19 <= (int)uVar3) {
          uVar19 = (uVar3 ^ 0xffffffe0) + 0x21;
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar2 * dimension != uVar18);
  }
  switch(local_a09) {
  case '\0':
    DynamicIntegerPointsKdTreeEncoder<0>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<0> *)local_850,dimension);
    local_988 = 0;
    puStack_998 = &local_9e0;
    local_9a0 = (ulong)local_9e0;
    local_978 = local_9dc;
    local_990 = local_9dc;
    end._20_4_ = uStack_98c;
    end.dimensionality_ = local_9dc;
    auVar5._12_4_ = uStack_974;
    auVar5._8_4_ = local_9dc;
    auVar5._0_8_ = puStack_998;
    auVar5._16_8_ = 0;
    end.vec_ = (PointDVector<unsigned_int> *)puStack_998;
    end.item_ = local_9a0;
    local_9f8 = uVar19;
    puStack_980 = puStack_998;
    bVar13 = DynamicIntegerPointsKdTreeEncoder<0>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<0> *)local_850,
                        (PointDVectorIterator)(auVar5 << 0x40),end,&local_9f8,out_buffer);
    DynamicIntegerPointsKdTreeEncoder<0>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<0> *)local_850);
    break;
  case '\x01':
    DynamicIntegerPointsKdTreeEncoder<1>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<1> *)local_850,dimension);
    local_958 = 0;
    puStack_968 = &local_9e0;
    local_970 = (ulong)local_9e0;
    local_948 = local_9dc;
    local_960 = local_9dc;
    end_03._20_4_ = uStack_95c;
    end_03.dimensionality_ = local_9dc;
    auVar9._12_4_ = uStack_944;
    auVar9._8_4_ = local_9dc;
    auVar9._0_8_ = puStack_968;
    auVar9._16_8_ = 0;
    end_03.vec_ = (PointDVector<unsigned_int> *)puStack_968;
    end_03.item_ = local_970;
    local_9f8 = uVar19;
    puStack_950 = puStack_968;
    bVar13 = DynamicIntegerPointsKdTreeEncoder<1>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<1> *)local_850,
                        (PointDVectorIterator)(auVar9 << 0x40),end_03,&local_9f8,out_buffer);
    DynamicIntegerPointsKdTreeEncoder<1>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<1> *)local_850);
    break;
  case '\x02':
    DynamicIntegerPointsKdTreeEncoder<2>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<2> *)local_850,dimension);
    local_928 = 0;
    puStack_938 = &local_9e0;
    local_940 = (ulong)local_9e0;
    local_918 = local_9dc;
    local_930 = local_9dc;
    end_01._20_4_ = uStack_92c;
    end_01.dimensionality_ = local_9dc;
    auVar7._12_4_ = uStack_914;
    auVar7._8_4_ = local_9dc;
    auVar7._0_8_ = puStack_938;
    auVar7._16_8_ = 0;
    end_01.vec_ = (PointDVector<unsigned_int> *)puStack_938;
    end_01.item_ = local_940;
    local_9f8 = uVar19;
    puStack_920 = puStack_938;
    bVar13 = DynamicIntegerPointsKdTreeEncoder<2>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<2> *)local_850,
                        (PointDVectorIterator)(auVar7 << 0x40),end_01,&local_9f8,out_buffer);
    DynamicIntegerPointsKdTreeEncoder<2>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<2> *)local_850);
    break;
  case '\x03':
    DynamicIntegerPointsKdTreeEncoder<3>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<3> *)local_850,dimension);
    local_8f8 = 0;
    puStack_908 = &local_9e0;
    local_910 = (ulong)local_9e0;
    local_8e8 = local_9dc;
    local_900 = local_9dc;
    end_02._20_4_ = uStack_8fc;
    end_02.dimensionality_ = local_9dc;
    auVar8._12_4_ = uStack_8e4;
    auVar8._8_4_ = local_9dc;
    auVar8._0_8_ = puStack_908;
    auVar8._16_8_ = 0;
    end_02.vec_ = (PointDVector<unsigned_int> *)puStack_908;
    end_02.item_ = local_910;
    local_9f8 = uVar19;
    puStack_8f0 = puStack_908;
    bVar13 = DynamicIntegerPointsKdTreeEncoder<3>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<3> *)local_850,
                        (PointDVectorIterator)(auVar8 << 0x40),end_02,&local_9f8,out_buffer);
    DynamicIntegerPointsKdTreeEncoder<3>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<3> *)local_850);
    break;
  case '\x04':
    DynamicIntegerPointsKdTreeEncoder<4>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<4> *)local_850,dimension);
    local_8c8 = 0;
    puStack_8d8 = &local_9e0;
    local_8e0 = (ulong)local_9e0;
    local_8b8 = local_9dc;
    local_8d0 = local_9dc;
    end_00._20_4_ = uStack_8cc;
    end_00.dimensionality_ = local_9dc;
    auVar6._12_4_ = uStack_8b4;
    auVar6._8_4_ = local_9dc;
    auVar6._0_8_ = puStack_8d8;
    auVar6._16_8_ = 0;
    end_00.vec_ = (PointDVector<unsigned_int> *)puStack_8d8;
    end_00.item_ = local_8e0;
    local_9f8 = uVar19;
    puStack_8c0 = puStack_8d8;
    bVar13 = DynamicIntegerPointsKdTreeEncoder<4>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<4> *)local_850,
                        (PointDVectorIterator)(auVar6 << 0x40),end_00,&local_9f8,out_buffer);
    DynamicIntegerPointsKdTreeEncoder<4>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<4> *)local_850);
    break;
  case '\x05':
    DynamicIntegerPointsKdTreeEncoder<5>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<5> *)local_850,dimension);
    local_898 = 0;
    puStack_8a8 = &local_9e0;
    local_8b0 = (ulong)local_9e0;
    local_888 = local_9dc;
    local_8a0 = local_9dc;
    end_04._20_4_ = uStack_89c;
    end_04.dimensionality_ = local_9dc;
    auVar10._12_4_ = uStack_884;
    auVar10._8_4_ = local_9dc;
    auVar10._0_8_ = puStack_8a8;
    auVar10._16_8_ = 0;
    end_04.vec_ = (PointDVector<unsigned_int> *)puStack_8a8;
    end_04.item_ = local_8b0;
    local_9f8 = uVar19;
    puStack_890 = puStack_8a8;
    bVar13 = DynamicIntegerPointsKdTreeEncoder<5>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<5> *)local_850,
                        (PointDVectorIterator)(auVar10 << 0x40),end_04,&local_9f8,out_buffer);
    DynamicIntegerPointsKdTreeEncoder<5>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<5> *)local_850);
    break;
  case '\x06':
    DynamicIntegerPointsKdTreeEncoder<6>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<6> *)local_850,dimension);
    local_868 = 0;
    puStack_878 = &local_9e0;
    local_880 = (ulong)local_9e0;
    local_858 = local_9dc;
    local_870 = local_9dc;
    end_05._20_4_ = uStack_86c;
    end_05.dimensionality_ = local_9dc;
    auVar11._12_4_ = uStack_854;
    auVar11._8_4_ = local_9dc;
    auVar11._0_8_ = puStack_878;
    auVar11._16_8_ = 0;
    end_05.vec_ = (PointDVector<unsigned_int> *)puStack_878;
    end_05.item_ = local_880;
    local_9f8 = uVar19;
    puStack_860 = puStack_878;
    bVar13 = DynamicIntegerPointsKdTreeEncoder<6>::
             EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       ((DynamicIntegerPointsKdTreeEncoder<6> *)local_850,
                        (PointDVectorIterator)(auVar11 << 0x40),end_05,&local_9f8,out_buffer);
    DynamicIntegerPointsKdTreeEncoder<6>::~DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<6> *)local_850);
    break;
  default:
    goto switchD_0016800d_default;
  }
  if (bVar13 == false) {
switchD_0016800d_default:
    bVar13 = false;
  }
  else {
    bVar13 = true;
  }
  if (local_9d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_9d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar13;
}

Assistant:

bool KdTreeAttributesEncoder::EncodePortableAttributes(
    EncoderBuffer *out_buffer) {
  // Encode the data using the kd tree encoder algorithm. The data is first
  // copied to a PointDVector that provides all the API expected by the core
  // encoding algorithm.

  // We limit the maximum value of compression_level to 6 as we don't currently
  // have viable algorithms for higher compression levels.
  uint8_t compression_level =
      std::min(10 - encoder()->options()->GetSpeed(), 6);
  DRACO_DCHECK_LE(compression_level, 6);

  if (compression_level == 6 && num_components_ > 15) {
    // Don't use compression level for CL >= 6. Axis selection is currently
    // encoded using 4 bits.
    compression_level = 5;
  }

  out_buffer->Encode(compression_level);

  // Init PointDVector. The number of dimensions is equal to the total number
  // of dimensions across all attributes.
  const int num_points = encoder()->point_cloud()->num_points();
  PointDVector<uint32_t> point_vector(num_points, num_components_);

  int num_processed_components = 0;
  int num_processed_quantized_attributes = 0;
  int num_processed_signed_components = 0;
  // Copy data to the point vector.
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int att_id = GetAttributeId(i);
    const PointAttribute *const att =
        encoder()->point_cloud()->attribute(att_id);
    const PointAttribute *source_att = nullptr;
    if (att->data_type() == DT_UINT32 || att->data_type() == DT_UINT16 ||
        att->data_type() == DT_UINT8 || att->data_type() == DT_INT32 ||
        att->data_type() == DT_INT16 || att->data_type() == DT_INT8) {
      // Use the original attribute.
      source_att = att;
    } else if (att->data_type() == DT_FLOAT32) {
      // Use the portable (quantized) attribute instead.
      source_att =
          quantized_portable_attributes_[num_processed_quantized_attributes]
              .get();
      num_processed_quantized_attributes++;
    } else {
      // Unsupported data type.
      return false;
    }

    if (source_att == nullptr) {
      return false;
    }

    // Copy source_att to the vector.
    if (source_att->data_type() == DT_UINT32) {
      // If the data type is the same as the one used by the point vector, we
      // can directly copy individual elements.
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        const uint8_t *const att_value_address = source_att->GetAddress(avi);
        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   att_value_address);
      }
    } else if (source_att->data_type() == DT_INT32 ||
               source_att->data_type() == DT_INT16 ||
               source_att->data_type() == DT_INT8) {
      // Signed values need to be converted to unsigned before they are stored
      // in the point vector.
      std::vector<int32_t> signed_point(source_att->num_components());
      std::vector<uint32_t> unsigned_point(source_att->num_components());
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        source_att->ConvertValue<int32_t>(avi, &signed_point[0]);
        for (int c = 0; c < source_att->num_components(); ++c) {
          unsigned_point[c] =
              signed_point[c] -
              min_signed_values_[num_processed_signed_components + c];
        }

        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   &unsigned_point[0]);
      }
      num_processed_signed_components += source_att->num_components();
    } else {
      // If the data type of the attribute is different, we have to convert the
      // value before we put it to the point vector.
      std::vector<uint32_t> point(source_att->num_components());
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        source_att->ConvertValue<uint32_t>(avi, &point[0]);
        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   point.data());
      }
    }
    num_processed_components += source_att->num_components();
  }

  // Compute the maximum bit length needed for the kd tree encoding.
  int num_bits = 0;
  const uint32_t *data = point_vector[0];
  for (int i = 0; i < num_points * num_components_; ++i) {
    if (data[i] > 0) {
      const int msb = MostSignificantBit(data[i]) + 1;
      if (msb > num_bits) {
        num_bits = msb;
      }
    }
  }

  switch (compression_level) {
    case 6: {
      DynamicIntegerPointsKdTreeEncoder<6> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 5: {
      DynamicIntegerPointsKdTreeEncoder<5> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 4: {
      DynamicIntegerPointsKdTreeEncoder<4> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 3: {
      DynamicIntegerPointsKdTreeEncoder<3> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 2: {
      DynamicIntegerPointsKdTreeEncoder<2> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 1: {
      DynamicIntegerPointsKdTreeEncoder<1> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 0: {
      DynamicIntegerPointsKdTreeEncoder<0> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    // Compression level and/or encoding speed seem wrong.
    default:
      return false;
  }
  return true;
}